

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_item_reserve.c
# Opt level: O3

mpt_config_item * mpt_config_item_reserve(mpt_array *arr,mpt_path *path)

{
  size_t sVar1;
  int nlen;
  int iVar2;
  mpt_type_traits *pmVar3;
  mpt_buffer *pmVar4;
  ulong uVar5;
  mpt_buffer *pmVar6;
  void *pvVar7;
  int *piVar8;
  long lVar9;
  char *pcVar10;
  mpt_buffer *pmVar11;
  mpt_identifier *id;
  
  pcVar10 = path->base;
  sVar1 = path->off;
  nlen = mpt_path_next(path);
  if (-1 < nlen) {
    pcVar10 = pcVar10 + sVar1;
    do {
      pmVar3 = mpt_config_item_traits();
      pmVar6 = (mpt_buffer *)((mpt_buffer *)arr)->_vptr;
      if (pmVar6 == (mpt_buffer *)0x0) {
LAB_0010c9fc:
        pmVar6 = _mpt_buffer_alloc(0x20,2);
        if (pmVar6 == (mpt_buffer *)0x0) {
          return (mpt_config_item *)0x0;
        }
        pmVar4 = pmVar6 + 1;
        pmVar6->_content_traits = pmVar3;
        pmVar6->_used = 0x20;
        ((mpt_buffer *)arr)->_vptr = (_mpt_vptr_buffer *)pmVar6;
LAB_0010ca29:
        (*pmVar3->init)(pmVar4,(void *)0x0);
        arr = (mpt_array *)pmVar4;
      }
      else {
        if (pmVar6->_content_traits != pmVar3) {
          piVar8 = __errno_location();
          *piVar8 = 0x16;
          return (mpt_config_item *)0x0;
        }
        if ((_func_mpt_buffer_ptr_mpt_buffer_ptr_size_t *)pmVar6->_used <
            (_func_mpt_buffer_ptr_mpt_buffer_ptr_size_t *)0x20) {
LAB_0010c905:
          pmVar4 = (mpt_buffer *)mpt_array_insert(arr,(size_t)pmVar6->_used,0x20);
          if (pmVar4 == (mpt_buffer *)0x0) {
            return (mpt_config_item *)0x0;
          }
          goto LAB_0010ca29;
        }
        uVar5 = (ulong)pmVar6->_used >> 5;
        pmVar4 = (mpt_buffer *)0x0;
        pmVar11 = pmVar6;
        do {
          lVar9 = 1 - uVar5;
          id = (mpt_identifier *)&pmVar11[1]._size;
          while (id->_len != 0) {
            iVar2 = mpt_identifier_compare(id,pcVar10,nlen);
            if (iVar2 == 0) {
              if (path->len == 0) {
                return (mpt_config_item *)(id + -1);
              }
              arr = (mpt_array *)(id + -1);
              goto LAB_0010ca4b;
            }
            lVar9 = lVar9 + 1;
            id = id + 2;
            if (lVar9 == 1) {
              if (pmVar4 != (mpt_buffer *)0x0) goto LAB_0010c9aa;
              if (pmVar6 != (mpt_buffer *)0x0) goto LAB_0010c905;
              goto LAB_0010c9fc;
            }
          }
          pmVar11 = (mpt_buffer *)(id + -1);
          if (pmVar4 == (mpt_buffer *)0x0) {
            pmVar4 = pmVar11;
          }
          uVar5 = -lVar9;
        } while (lVar9 != 0);
LAB_0010c9aa:
        if (pmVar4->_content_traits != (mpt_type_traits *)0x0) {
          (**(code **)(pmVar4->_content_traits->init + 8))();
          pmVar4->_content_traits = (mpt_type_traits *)0x0;
        }
        arr = (mpt_array *)pmVar4;
        if ((mpt_buffer *)pmVar4->_vptr != (mpt_buffer *)0x0) {
          mpt_buffer_cut((mpt_buffer *)pmVar4->_vptr,0,(size_t)pmVar6->_used);
          mpt_array_reduce((mpt_array *)pmVar4);
        }
      }
      pvVar7 = mpt_identifier_set((mpt_identifier *)&((mpt_buffer *)arr)->_size,pcVar10,nlen);
      if (pvVar7 == (void *)0x0) {
        return (mpt_config_item *)0x0;
      }
      if (path->len == 0) {
        return (mpt_config_item *)(mpt_buffer *)arr;
      }
LAB_0010ca4b:
      pcVar10 = path->base + path->off;
      nlen = mpt_path_next(path);
    } while (-1 < nlen);
  }
  return (mpt_config_item *)0x0;
}

Assistant:

extern MPT_STRUCT(config_item) *mpt_config_item_reserve(_MPT_UARRAY_TYPE(MPT_STRUCT(config_item)) *arr, MPT_STRUCT(path) *path)
{
	const MPT_STRUCT(type_traits) *traits;
	const MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(config_item) *item, *unused;
	const char *name;
	size_t item_count = 0;
	int len;
	
	name = path->base + path->off;
	if ((len = mpt_path_next(path)) < 0) {
		return 0;
	}
	traits = mpt_config_item_traits();
	if ((buf = arr->_buf)) {
		if (buf->_content_traits != traits) {
			errno = EINVAL;
			return 0;
		}
		item_count = buf->_used / sizeof(*item);
	}
	item = (MPT_STRUCT(config_item) *) (buf + 1);
	unused = 0;
	while (item_count--) {
		if (item->identifier._len == 0) {
			if (!unused) {
				unused = item;
			}
			++item;
			continue;
		}
		if (mpt_identifier_compare(&item->identifier, name, len) != 0) {
			++item;
			continue;
		}
		if (path->len) {
			return mpt_config_item_reserve(&item->elements, path);
		}
		return item;
	}
	if (!unused) {
		/* create initial buffer with unique array flags */
		if (!buf) {
			MPT_STRUCT(buffer) *b;
			if (!(b = _mpt_buffer_alloc(sizeof(*item), MPT_ENUM(BufferNoCopy)))) {
				return 0;
			}
			unused = (MPT_STRUCT(config_item) *) (b + 1);
			b->_content_traits = traits;
			b->_used = sizeof(*item);
			arr->_buf = b;
		}
		else if (!(unused = mpt_array_insert(arr, buf->_used, sizeof(*unused)))) {
			return 0;
		}
		traits->init(unused, 0);
	}
	else {
		MPT_INTERFACE(metatype) *old;
		MPT_STRUCT(buffer) *sub;
		if ((old = unused->value)) {
			old->_vptr->unref(old);
			unused->value = 0;
		}
		if ((sub = unused->elements._buf)) {
			mpt_buffer_cut(sub, 0, buf->_used);
			mpt_array_reduce(&unused->elements);
		}
	}
	if (!mpt_identifier_set(&unused->identifier, name, len)) {
		return 0;
	}
	if (path->len) {
		return mpt_config_item_reserve(&unused->elements, path);
	}
	return unused;
}